

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

void dumpSize(DumpState *D,size_t x)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  lu_byte buff [10];
  byte local_9;
  
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    (&local_9)[lVar4] = (byte)x & 0x7f;
    bVar1 = 0x7f < x;
    lVar2 = lVar4 + -1;
    x = x >> 7;
  } while (bVar1);
  local_9 = local_9 | 0x80;
  if (D->status == 0) {
    iVar3 = (*D->writer)(D->L,&local_9 + lVar4,-(lVar4 + -1),D->data);
    D->status = iVar3;
  }
  return;
}

Assistant:

static void dumpSize (DumpState *D, size_t x) {
  lu_byte buff[DIBS];
  int n = 0;
  do {
    buff[DIBS - (++n)] = x & 0x7f;  /* fill buffer in reverse order */
    x >>= 7;
  } while (x != 0);
  buff[DIBS - 1] |= 0x80;  /* mark last byte */
  dumpVector(D, buff + DIBS - n, n);
}